

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

cmd_ln_t * cmd_ln_parse_r(ps_config_t *inout_cmdln,ps_arg_t *defn,int32 argc,char **argv,int strict)

{
  int32 iVar1;
  uint uVar2;
  ps_config_t *config;
  hash_table_t *h;
  ps_arg_t *ppVar3;
  cmd_ln_val_t *val;
  char *fmt;
  ulong uVar4;
  ps_arg_t *val_00;
  char *pcVar5;
  long lVar6;
  long lVar7;
  void *v;
  ps_config_t *local_48;
  ulong local_40;
  long local_38;
  
  config = inout_cmdln;
  if (inout_cmdln == (ps_config_t *)0x0) {
    config = ps_config_init(defn);
    config->defn = defn;
  }
  h = hash_table_new(0x32,0);
  if (defn == (ps_arg_t *)0x0) {
    local_40 = 0;
  }
  else {
    uVar4 = 0;
    for (val_00 = defn; val_00->name != (char *)0x0; val_00 = val_00 + 1) {
      ppVar3 = (ps_arg_t *)hash_table_enter(h,val_00->name,val_00);
      if ((strict != 0) && (val_00 != ppVar3)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x140,"Duplicate argument name in definition: %s\n",val_00->name);
        goto LAB_00109d1b;
      }
      uVar4 = uVar4 + 1;
    }
    local_40 = uVar4 & 0xffffffff;
  }
  if (argc < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(**argv != '-');
  }
  local_38 = (long)argc;
  lVar7 = uVar4 + 1;
  local_48 = inout_cmdln;
  do {
    if (local_38 <= lVar7 + -1) {
      lVar6 = local_40 << 5;
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 0x20) {
        if (((*(byte *)((long)&defn->type + lVar7) & 1) != 0) &&
           (iVar1 = hash_table_lookup(config->ht,*(char **)((long)&defn->name + lVar7),&v),
           iVar1 != 0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x186,"Missing required argument %s\n",*(undefined8 *)((long)&defn->name + lVar7)
                 );
        }
      }
      if (argc == 1 && strict != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x18e,"No arguments given\n");
        if (h != (hash_table_t *)0x0) {
          hash_table_free(h);
        }
        if (local_48 == (ps_config_t *)0x0) {
          ps_config_free(config);
        }
        config = (cmd_ln_t *)0x0;
      }
      else {
        hash_table_free(h);
      }
      return config;
    }
    pcVar5 = argv[lVar7 + -1];
    pcVar5 = pcVar5 + (ulong)(pcVar5[*pcVar5 == '-'] == '-') + (ulong)(*pcVar5 == '-');
    iVar1 = hash_table_lookup(h,pcVar5,&v);
    uVar2 = (uint)lVar7;
    if (iVar1 < 0) {
      if (strict != 0) {
        fmt = "Unknown argument name \'%s\'\n";
        lVar7 = 0x15f;
        goto LAB_00109d07;
      }
      if (defn == (ps_arg_t *)0x0) {
        v = (void *)0x0;
        if ((int)uVar2 < argc) goto LAB_00109b86;
        goto LAB_00109ca1;
      }
    }
    else {
      if (argc <= (int)uVar2) {
LAB_00109ca1:
        fmt = "Argument value for \'%s\' missing\n";
        lVar7 = 0x16b;
LAB_00109d07:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,lVar7,fmt,pcVar5);
        inout_cmdln = local_48;
LAB_00109d1b:
        if (h != (hash_table_t *)0x0) {
          hash_table_free(h);
        }
        if (inout_cmdln == (ps_config_t *)0x0) {
          ps_config_free(config);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x19e,"Failed to parse arguments list\n");
        return (cmd_ln_t *)0x0;
      }
      if (v == (void *)0x0) {
        uVar2 = (int)uVar4 + 1;
LAB_00109b86:
        val = cmd_ln_val_init(8,pcVar5,argv[uVar2]);
      }
      else {
        val = cmd_ln_val_init(*(int *)((long)v + 8),pcVar5,argv[lVar7]);
        if (val == (cmd_ln_val_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x173,"Bad argument value for %s: %s\n",pcVar5,argv[lVar7]);
          inout_cmdln = local_48;
          goto LAB_00109d1b;
        }
      }
      v = hash_table_enter(config->ht,val->name,val);
      if ((cmd_ln_val_t *)v != val) {
        v = hash_table_replace(config->ht,val->name,val);
        cmd_ln_val_free((cmd_ln_val_t *)v);
      }
    }
    uVar4 = uVar4 + 2;
    lVar7 = lVar7 + 2;
  } while( true );
}

Assistant:

ps_config_t *
cmd_ln_parse_r(ps_config_t *inout_cmdln, const ps_arg_t * defn,
               int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    ps_config_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = ps_config_init(defn);
        cmdln->defn = defn;
    }
    else /* FIXME: definitions should just be in the ps_config_t */
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* skip argv[0] if it doesn't start with dash (starting with a
     * dash would only happen if called from parse_options()) */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        ps_arg_t *argdef;
        cmd_ln_val_t *val;
        char *name;
        void *v;

        name = argv[j];
        if (*name && *name == '-')
            ++name;
        if (*name && *name == '-')
            ++name;
        if (hash_table_lookup(defidx, name, &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", name);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (ps_arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            E_ERROR("Argument value for '%s' missing\n", name);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, name, argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, name, argv[j + 1])) == NULL) {
                E_ERROR("Bad argument value for %s: %s\n", name, argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            v = hash_table_replace(cmdln->ht, val->name, (void *)val);
            cmd_ln_val_free((cmd_ln_val_t *)v);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given\n");
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            ps_config_free(cmdln);
        return NULL;
    }

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        ps_config_free(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}